

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReferenceCounted.h
# Opt level: O1

void __thiscall
irr::video::COpenGL3MaterialRenderer::COpenGL3MaterialRenderer
          (COpenGL3MaterialRenderer *this,COpenGL3DriverBase *driver,
          IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,s32 userData)

{
  *(undefined8 *)&this->field_0x58 = 0;
  *(undefined4 *)&this->field_0x60 = 1;
  (this->super_IMaterialRenderer)._vptr_IMaterialRenderer = (_func_int **)0x26a6c8;
  *(undefined8 *)&this->field_0x50 = 0x26a7e0;
  *(undefined8 *)&(this->super_IMaterialRenderer).field_0x8 = 0x26a768;
  *(COpenGL3DriverBase **)&(this->super_IMaterialRenderer).field_0x10 = driver;
  *(IShaderConstantSetCallBack **)&(this->super_IMaterialRenderer).field_0x18 = callback;
  this->Alpha = false;
  this->Blending = false;
  *(undefined8 *)&this->Program = 0;
  *(undefined8 *)
   ((long)&(this->UniformInfo).m_data.
           super__Vector_base<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->UniformInfo).m_data.
  super__Vector_base<irr::video::COpenGL3MaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGL3MaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->UniformInfo).is_sorted = true;
  this->UserData = userData;
  if (baseMaterial != EMT_TRANSPARENT_ALPHA_CHANNEL) {
    if (baseMaterial == EMT_ONETEXTURE_BLEND) {
      this->Blending = true;
      goto LAB_001fbd40;
    }
    if (baseMaterial != EMT_TRANSPARENT_VERTEX_ALPHA) goto LAB_001fbd40;
  }
  this->Alpha = true;
LAB_001fbd40:
  if (callback != (IShaderConstantSetCallBack *)0x0) {
    *(int *)(&callback->field_0x10 + (long)callback->_vptr_IShaderConstantSetCallBack[-3]) =
         *(int *)(&callback->field_0x10 + (long)callback->_vptr_IShaderConstantSetCallBack[-3]) + 1;
  }
  return;
}

Assistant:

IReferenceCounted() :
			DebugName(0), ReferenceCounter(1)
	{
	}